

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name-tree.c
# Opt level: O1

int nametree_clean(ndn_nametree_t *nametree,int num)

{
  int iVar1;
  int iVar2;
  long lVar3;
  
  iVar1 = 0xffff;
  if (num != 0xffff) {
    lVar3 = (ulong)(uint)num * 0x2e;
    iVar1 = nametree_clean(nametree,(uint)*(ushort *)(nametree + lVar3 + 0x26));
    *(short *)(nametree + lVar3 + 0x26) = (short)iVar1;
    iVar2 = nametree_clean(nametree,(uint)*(ushort *)(nametree + lVar3 + 0x28));
    *(short *)(nametree + lVar3 + 0x28) = (short)iVar2;
    iVar1 = num;
    if (((*(short *)(nametree + lVar3 + 0x2c) == -1) && (*(short *)(nametree + lVar3 + 0x2a) == -1))
       && (*(short *)(nametree + lVar3 + 0x26) == -1)) {
      *(undefined2 *)(nametree + lVar3 + 0x26) = 0xffff;
      *(undefined4 *)(nametree + lVar3 + 0x2a) = 0xffffffff;
      *(undefined2 *)(nametree + lVar3 + 0x28) = *(undefined2 *)(nametree + 0x28);
      *(short *)(nametree + 0x28) = (short)num;
      iVar1 = iVar2;
    }
  }
  return iVar1;
}

Assistant:

static int
nametree_clean(ndn_nametree_t *nametree, int num)
{
  int ret = 0;
  if (num == NDN_INVALID_ID) {
    return NDN_INVALID_ID;
  }
  else {
    (*nametree)[num].left_child = nametree_clean(nametree, (*nametree)[num].left_child);
    (*nametree)[num].right_bro = nametree_clean(nametree, (*nametree)[num].right_bro);
    if ((*nametree)[num].fib_id == NDN_INVALID_ID &&
        (*nametree)[num].pit_id == NDN_INVALID_ID &&
        (*nametree)[num].left_child == NDN_INVALID_ID) {
      ret = (*nametree)[num].right_bro;
      nametree_refresh(nametree, num);
      return ret;
    }
    else {
      return num;
    }
  }
}